

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::OnEnd(TypeChecker *this)

{
  Result RVar1;
  Enum EVar2;
  Label *label;
  Label *local_20;
  
  RVar1 = GetLabel(this,0,&local_20);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    if (6 < (int)local_20->label_type) {
      __assert_fail("static_cast<int>(label->label_type) < kLabelTypeCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/type-checker.cc"
                    ,0x237,"Result wabt::TypeChecker::OnEnd()");
    }
    if ((local_20->label_type == If) && (RVar1 = OnElse(this), RVar1.enum_ == Error)) {
      return (Result)Error;
    }
    RVar1 = OnEnd(this,local_20,OnEnd::s_label_type_name[(int)local_20->label_type],
                  OnEnd::s_label_type_name[(int)local_20->label_type]);
    EVar2 = (Enum)(RVar1.enum_ == Error);
  }
  return (Result)EVar2;
}

Assistant:

Result TypeChecker::OnEnd() {
  Result result = Result::Ok;
  static const char* s_label_type_name[] = {
      "function", "block", "loop", "if", "if false branch", "try", "try catch"};
  WABT_STATIC_ASSERT(WABT_ARRAY_SIZE(s_label_type_name) == kLabelTypeCount);
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  assert(static_cast<int>(label->label_type) < kLabelTypeCount);
  if (label->label_type == LabelType::If) {
    // An if without an else will just pass the params through, so the result
    // types must be the same as the param types. It has the same behavior as
    // an empty else block.
    CHECK_RESULT(OnElse());
  }
  const char* desc = s_label_type_name[static_cast<int>(label->label_type)];
  result |= OnEnd(label, desc, desc);
  return result;
}